

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

aiScene * __thiscall Assimp::Importer::ApplyPostProcessing(Importer *this,uint pFlags)

{
  ProgressHandler *pPVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Logger *pLVar5;
  size_type sVar6;
  reference ppBVar7;
  pointer pPVar8;
  size_type sVar9;
  ScenePrivateData *pSVar10;
  ulong uVar11;
  pointer local_120;
  undefined1 local_e8 [8];
  ValidateDSProcess ds_1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  value_type local_78;
  BaseProcess *process;
  uint a;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  local_60;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  undefined1 local_50 [8];
  ValidateDSProcess ds;
  uint local_1c;
  uint pFlags_local;
  Importer *this_local;
  
  if (this->pimpl->mScene == (aiScene *)0x0) {
    this_local = (Importer *)0x0;
  }
  else if (pFlags == 0) {
    this_local = (Importer *)this->pimpl->mScene;
  }
  else {
    bVar2 = _ValidateFlags(pFlags);
    if (!bVar2) {
      __assert_fail("_ValidateFlags(pFlags)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Importer.cpp"
                    ,0x2de,"const aiScene *Assimp::Importer::ApplyPostProcessing(unsigned int)");
    }
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"Entering post processing pipeline");
    if ((pFlags & 0x400) != 0) {
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)local_50);
      BaseProcess::ExecuteOnScene((BaseProcess *)local_50,this);
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_1_ =
           this->pimpl->mScene == (aiScene *)0x0;
      if (profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_1_) {
        this_local = (Importer *)0x0;
      }
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._5_3_ = 0;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)local_50);
      if (profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ != 0) {
        return (aiScene *)this_local;
      }
    }
    local_1c = pFlags;
    if ((this->pimpl->bExtraVerbose & 1U) != 0) {
      local_1c = pFlags | 0x400;
    }
    process._7_1_ = 0;
    iVar3 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
    if (iVar3 == 0) {
      local_120 = (pointer)0x0;
    }
    else {
      local_120 = (pointer)operator_new(0x30);
      process._7_1_ = 1;
      _a = local_120;
      Profiling::Profiler::Profiler(local_120);
    }
    std::unique_ptr<Assimp::Profiling::Profiler,std::default_delete<Assimp::Profiling::Profiler>>::
    unique_ptr<std::default_delete<Assimp::Profiling::Profiler>,void>
              ((unique_ptr<Assimp::Profiling::Profiler,std::default_delete<Assimp::Profiling::Profiler>>
                *)&local_60,local_120);
    for (process._0_4_ = 0; uVar11 = (ulong)(uint)process,
        sVar6 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                          (&this->pimpl->mPostProcessingSteps), uVar11 < sVar6;
        process._0_4_ = (uint)process + 1) {
      ppBVar7 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::
                operator[](&this->pimpl->mPostProcessingSteps,(ulong)(uint)process);
      uVar4 = (uint)process;
      local_78 = *ppBVar7;
      pPVar1 = this->pimpl->mProgressHandler;
      sVar6 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                        (&this->pimpl->mPostProcessingSteps);
      (*pPVar1->_vptr_ProgressHandler[4])(pPVar1,(ulong)uVar4,sVar6 & 0xffffffff);
      uVar4 = (*local_78->_vptr_BaseProcess[2])(local_78,(ulong)local_1c);
      if ((uVar4 & 1) != 0) {
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_60);
        if (bVar2) {
          pPVar8 = std::
                   unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                   ::operator->(&local_60);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"postprocess",&local_99);
          Profiling::Profiler::BeginRegion(pPVar8,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator(&local_99);
        }
        BaseProcess::ExecuteOnScene(local_78,this);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_60);
        if (bVar2) {
          pPVar8 = std::
                   unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                   ::operator->(&local_60);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"postprocess",(allocator<char> *)((long)&ds_1.mScene + 7));
          Profiling::Profiler::EndRegion(pPVar8,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ds_1.mScene + 7));
        }
      }
      if (this->pimpl->mScene == (aiScene *)0x0) break;
      if ((this->pimpl->bExtraVerbose & 1U) != 0) {
        pLVar5 = DefaultLogger::get();
        Logger::debug(pLVar5,"Verbose Import: re-validating data structures");
        ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)local_e8);
        BaseProcess::ExecuteOnScene((BaseProcess *)local_e8,this);
        if (this->pimpl->mScene == (aiScene *)0x0) {
          pLVar5 = DefaultLogger::get();
          Logger::error(pLVar5,"Verbose Import: failed to re-validate data structures");
          profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ = 2;
        }
        else {
          profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ = 0;
        }
        ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)local_e8);
        if (profiler._M_t.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ != 0)
        break;
      }
    }
    pPVar1 = this->pimpl->mProgressHandler;
    sVar6 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                      (&this->pimpl->mPostProcessingSteps);
    sVar9 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                      (&this->pimpl->mPostProcessingSteps);
    (*pPVar1->_vptr_ProgressHandler[4])(pPVar1,sVar6 & 0xffffffff,sVar9 & 0xffffffff);
    if (this->pimpl->mScene != (aiScene *)0x0) {
      pSVar10 = ScenePriv(this->pimpl->mScene);
      pSVar10->mPPStepsApplied = local_1c | pSVar10->mPPStepsApplied;
    }
    SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"Leaving post processing pipeline");
    std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ::~unique_ptr(&local_60);
    this_local = (Importer *)this->pimpl->mScene;
  }
  return (aiScene *)this_local;
}

Assistant:

const aiScene* Importer::ApplyPostProcessing(unsigned int pFlags)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // Return immediately if no scene is active
    if (!pimpl->mScene) {
        return NULL;
    }

    // If no flags are given, return the current scene with no further action
    if (!pFlags) {
        return pimpl->mScene;
    }

    // In debug builds: run basic flag validation
    ai_assert(_ValidateFlags(pFlags));
    ASSIMP_LOG_INFO("Entering post processing pipeline");

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    // The ValidateDS process plays an exceptional role. It isn't contained in the global
    // list of post-processing steps, so we need to call it manually.
    if (pFlags & aiProcess_ValidateDataStructure)
    {
        ValidateDSProcess ds;
        ds.ExecuteOnScene (this);
        if (!pimpl->mScene) {
            return NULL;
        }
    }
#endif // no validation
#ifdef ASSIMP_BUILD_DEBUG
    if (pimpl->bExtraVerbose)
    {
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        ASSIMP_LOG_ERROR("Verbose Import is not available due to build settings");
#endif  // no validation
        pFlags |= aiProcess_ValidateDataStructure;
    }
#else
    if (pimpl->bExtraVerbose) {
        ASSIMP_LOG_WARN("Not a debug build, ignoring extra verbose setting");
    }
#endif // ! DEBUG

    std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)   {

        BaseProcess* process = pimpl->mPostProcessingSteps[a];
        pimpl->mProgressHandler->UpdatePostProcess(static_cast<int>(a), static_cast<int>(pimpl->mPostProcessingSteps.size()) );
        if( process->IsActive( pFlags)) {

            if (profiler) {
                profiler->BeginRegion("postprocess");
            }

            process->ExecuteOnScene ( this );

            if (profiler) {
                profiler->EndRegion("postprocess");
            }
        }
        if( !pimpl->mScene) {
            break;
        }
#ifdef ASSIMP_BUILD_DEBUG

#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        continue;
#endif  // no validation

        // If the extra verbose mode is active, execute the ValidateDataStructureStep again - after each step
        if (pimpl->bExtraVerbose)   {
            ASSIMP_LOG_DEBUG("Verbose Import: re-validating data structures");

            ValidateDSProcess ds;
            ds.ExecuteOnScene (this);
            if( !pimpl->mScene) {
                ASSIMP_LOG_ERROR("Verbose Import: failed to re-validate data structures");
                break;
            }
        }
#endif // ! DEBUG
    }
    pimpl->mProgressHandler->UpdatePostProcess( static_cast<int>(pimpl->mPostProcessingSteps.size()), 
        static_cast<int>(pimpl->mPostProcessingSteps.size()) );

    // update private scene flags
    if( pimpl->mScene )
      ScenePriv(pimpl->mScene)->mPPStepsApplied |= pFlags;

    // clear any data allocated by post-process steps
    pimpl->mPPShared->Clean();
    ASSIMP_LOG_INFO("Leaving post processing pipeline");

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}